

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void check_files(ifstream *in_file,string *in_name,ofstream *out_file,string *out_name)

{
  char cVar1;
  ostream *poVar2;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open input file: ");
    out_name = in_name;
  }
  else {
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot open output file: ");
  }
  poVar2 = std::operator<<(poVar2,(string *)out_name);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void check_files(ifstream& in_file, string& in_name,
                 ofstream& out_file, string& out_name) {
  if (!in_file.is_open()) {
    cerr << "Cannot open input file: " << in_name << endl;
    exit(EXIT_FAILURE);
  }

  if (!out_file.is_open()) {
    cerr << "Cannot open output file: " << out_name << endl;
    exit(EXIT_FAILURE);
  }
}